

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  int iVar1;
  CURLcode CVar2;
  size_t length;
  size_t sVar3;
  void *pvVar4;
  bool bVar5;
  CURLcode result;
  size_t idlen;
  char *end;
  char *start;
  char *p;
  RTSP *rtsp;
  curl_off_t CSeq;
  char *header_local;
  Curl_easy *data_local;
  
  CSeq = (curl_off_t)header;
  header_local = (char *)data;
  iVar1 = curl_strnequal(header,"CSeq:",5);
  if (iVar1 == 0) {
    iVar1 = curl_strnequal((char *)CSeq,"Session:",8);
    if (iVar1 == 0) {
      iVar1 = curl_strnequal((char *)CSeq,"Transport:",10);
      if ((iVar1 != 0) &&
         (CVar2 = rtsp_parse_transport((Curl_easy *)header_local,(char *)(CSeq + 10)),
         CVar2 != CURLE_OK)) {
        return CVar2;
      }
    }
    else {
      end = (char *)(CSeq + 8);
      Curl_str_passblanks(&end);
      if (*end == '\0') {
        Curl_failf((Curl_easy *)header_local,"Got a blank Session ID");
        return CURLE_RTSP_SESSION_ERROR;
      }
      idlen = (size_t)end;
      while( true ) {
        bVar5 = false;
        if (' ' < *(char *)idlen) {
          bVar5 = *(char *)idlen != ';';
        }
        if (!bVar5) break;
        idlen = idlen + 1;
      }
      length = idlen - (long)end;
      if (*(long *)(header_local + 0x870) == 0) {
        pvVar4 = Curl_memdup0(end,length);
        *(void **)(header_local + 0x870) = pvVar4;
        if (*(long *)(header_local + 0x870) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        sVar3 = strlen(*(char **)(header_local + 0x870));
        if ((sVar3 != length) ||
           (iVar1 = strncmp(end,*(char **)(header_local + 0x870),length), iVar1 != 0)) {
          Curl_failf((Curl_easy *)header_local,"Got RTSP Session ID Line [%s], but wanted ID [%s]",
                     end,*(undefined8 *)(header_local + 0x870));
          return CURLE_RTSP_SESSION_ERROR;
        }
      }
    }
  }
  else {
    rtsp = (RTSP *)0x0;
    p = *(char **)(header_local + 0x180);
    start = (char *)(CSeq + 5);
    Curl_str_passblanks(&start);
    iVar1 = Curl_str_number(&start,(curl_off_t *)&rtsp,0x7fffffffffffffff);
    if (iVar1 != 0) {
      Curl_failf((Curl_easy *)header_local,"Unable to read the CSeq header: [%s]",CSeq);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    *(RTSP **)(p + 8) = rtsp;
    *(RTSP **)(header_local + 0x11a0) = rtsp;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    curl_off_t CSeq = 0;
    struct RTSP *rtsp = data->req.p.rtsp;
    const char *p = &header[5];
    Curl_str_passblanks(&p);
    if(Curl_str_number(&p, &CSeq, LONG_MAX)) {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    rtsp->CSeq_recv = (long)CSeq; /* mark the request */
    data->state.rtsp_CSeq_recv = (long)CSeq; /* update the handle */
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    Curl_str_passblanks(&start);

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while((*end > ' ') && (*end != ';'))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}